

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint::clear_AudioFeaturePrintType
          (AudioFeaturePrint *this)

{
  ulong uVar1;
  AudioFeaturePrint_Sound *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[0] == 0x14) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if ((puVar2 == (undefined8 *)0x0) &&
       (this_00 = (this->AudioFeaturePrintType_).sound_, this_00 != (AudioFeaturePrint_Sound *)0x0))
    {
      AudioFeaturePrint_Sound::~AudioFeaturePrint_Sound(this_00);
      operator_delete(this_00,0x18);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void AudioFeaturePrint::clear_AudioFeaturePrintType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.AudioFeaturePrint)
  switch (AudioFeaturePrintType_case()) {
    case kSound: {
      if (GetArenaForAllocation() == nullptr) {
        delete AudioFeaturePrintType_.sound_;
      }
      break;
    }
    case AUDIOFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = AUDIOFEATUREPRINTTYPE_NOT_SET;
}